

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O1

void Ivy_ObjDeleteFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanout)

{
  long lVar1;
  Ivy_Obj_t *pIVar2;
  long lVar3;
  Ivy_Obj_t **ppIVar4;
  long lVar5;
  long *plVar6;
  
  if (pFanin->pFanout == (Ivy_Obj_t *)0x0) {
    __assert_fail("pFanin->pFanout != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                  ,0xd0,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                  ,0x3b,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pFanout & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                  ,0x3c,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  pIVar2 = (Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe);
  if (pIVar2 == pFanin) {
    lVar1 = 0x28;
  }
  else {
    lVar1 = 0x30;
    if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
      __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                    ,0x3f,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
  }
  if (pFanout == (Ivy_Obj_t *)0x0) {
    lVar3 = 0;
  }
  else {
    if (pIVar2 == pFanin) {
      lVar3 = 0x38;
    }
    else {
      lVar3 = 0x40;
      if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0x34,"Ivy_Obj_t *Ivy_ObjPrevFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
    }
    lVar3 = *(long *)((long)&pFanout->Id + lVar3);
  }
  if (lVar3 == 0) {
    ppIVar4 = &pFanin->pFanout;
  }
  else if ((Ivy_Obj_t *)(*(ulong *)(lVar3 + 0x10) & 0xfffffffffffffffe) == pFanin) {
    ppIVar4 = (Ivy_Obj_t **)(lVar3 + 0x28);
  }
  else {
    if ((Ivy_Obj_t *)(*(ulong *)(lVar3 + 0x18) & 0xfffffffffffffffe) != pFanin) {
      __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                    ,0x59,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    ppIVar4 = (Ivy_Obj_t **)(lVar3 + 0x30);
  }
  if (*ppIVar4 == pFanout) {
    *ppIVar4 = *(Ivy_Obj_t **)((long)&pFanout->Id + lVar1);
    pIVar2 = (Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe);
    if (pIVar2 == pFanin) {
      lVar3 = 0x38;
    }
    else {
      lVar3 = 0x40;
      if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0x4a,"Ivy_Obj_t **Ivy_ObjPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
    }
    if (pFanout == (Ivy_Obj_t *)0x0) {
      lVar5 = 0;
    }
    else {
      if (pIVar2 == pFanin) {
        lVar5 = 0x28;
      }
      else {
        lVar5 = 0x30;
        if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
          __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                        ,0x27,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
        }
      }
      lVar5 = *(long *)((long)&pFanout->Id + lVar5);
    }
    if (lVar5 == 0) {
      plVar6 = (long *)0x0;
    }
    else if ((Ivy_Obj_t *)(*(ulong *)(lVar5 + 0x10) & 0xfffffffffffffffe) == pFanin) {
      plVar6 = (long *)(lVar5 + 0x38);
    }
    else {
      if ((Ivy_Obj_t *)(*(ulong *)(lVar5 + 0x18) & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0x68,"Ivy_Obj_t **Ivy_ObjNextPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      plVar6 = (long *)(lVar5 + 0x40);
    }
    if (plVar6 != (long *)0x0) {
      if ((Ivy_Obj_t *)*plVar6 != pFanout) {
        __assert_fail("ppPlaceN == NULL || *ppPlaceN == pFanout",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0xda,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      *plVar6 = *(long *)((long)&pFanout->Id + lVar3);
    }
    *(undefined8 *)((long)&pFanout->Id + lVar1) = 0;
    *(undefined8 *)((long)&pFanout->Id + lVar3) = 0;
    return;
  }
  __assert_fail("*ppPlaceN == pFanout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                ,0xd4,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ObjDeleteFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanout )
{
    Ivy_Obj_t ** ppPlace1, ** ppPlace2, ** ppPlaceN;
    assert( pFanin->pFanout != NULL );

    ppPlace1 = Ivy_ObjNextFanoutPlace(pFanin, pFanout);
    ppPlaceN = Ivy_ObjPrevNextFanoutPlace(pFanin, pFanout);
    assert( *ppPlaceN == pFanout );
    if ( ppPlaceN )
        *ppPlaceN = *ppPlace1;

    ppPlace2 = Ivy_ObjPrevFanoutPlace(pFanin, pFanout);
    ppPlaceN = Ivy_ObjNextPrevFanoutPlace(pFanin, pFanout);
    assert( ppPlaceN == NULL || *ppPlaceN == pFanout );
    if ( ppPlaceN )
        *ppPlaceN = *ppPlace2;

    *ppPlace1 = NULL;
    *ppPlace2 = NULL;
}